

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_print.c
# Opt level: O0

void h262_print_slice(h262_seqparm *seqparm,h262_picparm *picparm,h262_slice *slice)

{
  uint *in_RDX;
  undefined8 in_RDI;
  h262_macroblock *unaff_retaddr;
  h262_picparm *in_stack_00000008;
  int i;
  uint local_1c;
  
  printf("Slice:\n");
  printf("\tslice_vertical_position = %d\n",(ulong)*in_RDX);
  printf("\tquantiser_scale_code = %d\n",(ulong)in_RDX[1]);
  if (in_RDX[4] != 0xffffffff) {
    for (local_1c = in_RDX[4]; local_1c <= in_RDX[5]; local_1c = local_1c + 1) {
      h262_print_macroblock
                ((h262_seqparm *)slice,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20))
      ;
    }
  }
  return;
}

Assistant:

void h262_print_slice(struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_slice *slice) {
	int i;
	printf("Slice:\n");
	printf("\tslice_vertical_position = %d\n", slice->slice_vertical_position);
	printf("\tquantiser_scale_code = %d\n", slice->quantiser_scale_code);
	/* XXX**/
	if (slice->first_mb_in_slice == -1)
		return;
	for (i = slice->first_mb_in_slice; i <= slice->last_mb_in_slice; i++) {
		h262_print_macroblock(seqparm, picparm, &slice->mbs[i], i);
	}
}